

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O0

char * IoTHubMessage_GetProperty(IOTHUB_MESSAGE_HANDLE msg_handle,char *key)

{
  MAP_RESULT MVar1;
  _Bool local_29;
  LOGGER_LOG p_Stack_28;
  _Bool key_exists;
  LOGGER_LOG l;
  char *result;
  char *key_local;
  IOTHUB_MESSAGE_HANDLE msg_handle_local;
  
  result = key;
  key_local = (char *)msg_handle;
  if ((msg_handle == (IOTHUB_MESSAGE_HANDLE)0x0) || (key == (char *)0x0)) {
    p_Stack_28 = xlogging_get_log_function();
    if (p_Stack_28 != (LOGGER_LOG)0x0) {
      (*p_Stack_28)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                    ,"IoTHubMessage_GetProperty",0x23e,1,
                    "invalid parameter (NULL) to IoTHubMessage_GetProperty iotHubMessageHandle=%p, key=%p"
                    ,key_local,result);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    local_29 = false;
    MVar1 = Map_ContainsKey(msg_handle->properties,key,&local_29);
    if ((MVar1 == MAP_OK) && ((local_29 & 1U) != 0)) {
      l = (LOGGER_LOG)Map_GetValueFromKey(*(MAP_HANDLE *)(key_local + 0x10),result);
    }
    else {
      l = (LOGGER_LOG)0x0;
    }
  }
  return (char *)l;
}

Assistant:

const char* IoTHubMessage_GetProperty(IOTHUB_MESSAGE_HANDLE msg_handle, const char* key)
{
    const char* result;
    if (msg_handle == NULL || key == NULL)
    {
        LogError("invalid parameter (NULL) to IoTHubMessage_GetProperty iotHubMessageHandle=%p, key=%p", msg_handle, key);
        result = NULL;
    }
    else
    {
        bool key_exists = false;
        // The return value is not necessary, just check the key_exist variable
        if ((Map_ContainsKey(msg_handle->properties, key, &key_exists) == MAP_OK) && key_exists)
        {
            result = Map_GetValueFromKey(msg_handle->properties, key);
        }
        else
        {
            result = NULL;
        }
    }
    return result;
}